

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O2

void __thiscall Webcam::~Webcam(Webcam *this)

{
  int iVar1;
  undefined8 extraout_RAX;
  long lVar2;
  ulong uVar3;
  char *__ptr;
  undefined1 local_14 [4];
  
  if (this->isOpen != true) {
    return;
  }
  stop(this);
  iVar1 = xioctl(fd,0x40045613,local_14);
  if (iVar1 == -1) {
    errno_exit("VIDIOC_STREAMOFF");
  }
  else {
    uVar3 = 0xffffffffffffffff;
    lVar2 = 8;
    do {
      uVar3 = uVar3 + 1;
      __ptr = (char *)buffers;
      if (n_buffers <= uVar3) goto LAB_001155b6;
      iVar1 = munmap(*(void **)((long)buffers + lVar2 + -8),
                     *(size_t *)((long)&buffers->start + lVar2));
      lVar2 = lVar2 + 0x10;
    } while (iVar1 != -1);
    __ptr = "munmap";
    errno_exit("munmap");
LAB_001155b6:
    free(__ptr);
    iVar1 = close(fd);
    if (iVar1 != -1) {
      fd = -1;
      return;
    }
  }
  errno_exit("close");
  __clang_call_terminate(extraout_RAX);
}

Assistant:

Webcam::~Webcam()
{
    if(isOpen) {
        stop();
        stop_capturing ();
        uninit_device ();
        close_device ();
    }
}